

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

deUint32 glu::getRenderableBitsES3(ContextInfo *contextInfo,deUint32 internalFormat)

{
  bool bVar1;
  deUint32 internalFormat_local;
  ContextInfo *contextInfo_local;
  
  if ((internalFormat != 0x8051) && (3 < internalFormat - 0x8056)) {
    if (internalFormat - 0x81a5 < 2) {
      return 2;
    }
    if ((internalFormat != 0x8229) && (internalFormat != 0x822b)) {
      if (internalFormat == 0x822d) {
LAB_0277fe03:
        bVar1 = ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_color_buffer_float");
        if ((!bVar1) &&
           (bVar1 = ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_color_buffer_half_float"),
           !bVar1)) {
          return 0;
        }
        return 1;
      }
      if (internalFormat != 0x822e) {
        if (internalFormat == 0x822f) goto LAB_0277fe03;
        if (internalFormat != 0x8230) {
          if (internalFormat - 0x8231 < 0xc) {
            return 1;
          }
          if (internalFormat != 0x8814) {
            if (internalFormat == 0x881a) goto LAB_0277fe03;
            if (internalFormat == 0x88f0) {
              return 6;
            }
            if (internalFormat != 0x8c3a) {
              if (internalFormat == 0x8c43) {
                return 1;
              }
              if (internalFormat == 0x8cac) {
                return 2;
              }
              if (internalFormat == 0x8cad) {
                return 6;
              }
              if (internalFormat == 0x8d48) {
                return 4;
              }
              if (internalFormat == 0x8d62) {
                return 1;
              }
              if (internalFormat == 0x8d70) {
                return 1;
              }
              if (internalFormat == 0x8d76) {
                return 1;
              }
              if (internalFormat == 0x8d7c) {
                return 1;
              }
              if (internalFormat == 0x8d82) {
                return 1;
              }
              if (internalFormat == 0x8d88) {
                return 1;
              }
              if (internalFormat == 0x8d8e) {
                return 1;
              }
              if (internalFormat == 0x906f) {
                return 1;
              }
              return 0;
            }
          }
        }
      }
      bVar1 = ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_color_buffer_float");
      if (bVar1) {
        return 1;
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

static deUint32 getRenderableBitsES3 (const ContextInfo& contextInfo, deUint32 internalFormat)
{
	switch (internalFormat)
	{
		// Color-renderable formats
		case GL_RGBA32I:
		case GL_RGBA32UI:
		case GL_RGBA16I:
		case GL_RGBA16UI:
		case GL_RGBA8:
		case GL_RGBA8I:
		case GL_RGBA8UI:
		case GL_SRGB8_ALPHA8:
		case GL_RGB10_A2:
		case GL_RGB10_A2UI:
		case GL_RGBA4:
		case GL_RGB5_A1:
		case GL_RGB8:
		case GL_RGB565:
		case GL_RG32I:
		case GL_RG32UI:
		case GL_RG16I:
		case GL_RG16UI:
		case GL_RG8:
		case GL_RG8I:
		case GL_RG8UI:
		case GL_R32I:
		case GL_R32UI:
		case GL_R16I:
		case GL_R16UI:
		case GL_R8:
		case GL_R8I:
		case GL_R8UI:
			return RENDERABLE_COLOR;

		// GL_EXT_color_buffer_float
		case GL_RGBA32F:
		case GL_R11F_G11F_B10F:
		case GL_RG32F:
		case GL_R32F:
			if (contextInfo.isExtensionSupported("GL_EXT_color_buffer_float"))
				return RENDERABLE_COLOR;
			else
				return 0;

		// GL_EXT_color_buffer_float / GL_EXT_color_buffer_half_float
		case GL_RGBA16F:
		case GL_RG16F:
		case GL_R16F:
			if (contextInfo.isExtensionSupported("GL_EXT_color_buffer_float") ||
				contextInfo.isExtensionSupported("GL_EXT_color_buffer_half_float"))
				return RENDERABLE_COLOR;
			else
				return 0;

		// Depth formats
		case GL_DEPTH_COMPONENT32F:
		case GL_DEPTH_COMPONENT24:
		case GL_DEPTH_COMPONENT16:
			return RENDERABLE_DEPTH;

		// Depth+stencil formats
		case GL_DEPTH32F_STENCIL8:
		case GL_DEPTH24_STENCIL8:
			return RENDERABLE_DEPTH|RENDERABLE_STENCIL;

		// Stencil formats
		case GL_STENCIL_INDEX8:
			return RENDERABLE_STENCIL;

		default:
			return 0;
	}
}